

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O3

int __thiscall QButtonGroup::id(QButtonGroup *this,QAbstractButton *button)

{
  Data<QHashPrivate::Node<QAbstractButton*,int>> *this_00;
  Node<QAbstractButton_*,_int> *pNVar1;
  int iVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(*(long *)&this->field_0x8 + 0xa8);
  iVar2 = -1;
  local_18 = button;
  if (this_00 != (Data<QHashPrivate::Node<QAbstractButton*,int>> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QAbstractButton*,int>>::
             findNode<QAbstractButton*>(this_00,&local_18);
    if (pNVar1 != (Node<QAbstractButton_*,_int> *)0x0) {
      iVar2 = pNVar1->value;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::id(QAbstractButton *button) const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(button, -1);
}